

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ConstructBloomFilter(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel,Bitmask notReady)

{
  byte *pbVar1;
  u8 uVar2;
  ushort uVar3;
  int iVar4;
  Parse *pParse;
  Vdbe *p;
  SrcList *pSrcList;
  Index *pIdx;
  IndexedExpr *pIVar5;
  IndexedExpr *pIVar6;
  WhereLevel *pWVar7;
  byte bVar8;
  int iVar9;
  int dest;
  int iVar10;
  ulong uVar11;
  long lVar12;
  Op *pOVar13;
  uint uVar14;
  WhereTerm *pWVar15;
  WhereLoop *pWVar16;
  int iVar17;
  WhereTerm *pWVar18;
  uint uVar19;
  bool bVar20;
  
  pParse = pWInfo->pParse;
  p = pParse->pVdbe;
  pWVar16 = pLevel->pWLoop;
  pIVar5 = pParse->pIdxEpr;
  pIVar6 = pParse->pIdxPartExpr;
  pParse->pIdxEpr = (IndexedExpr *)0x0;
  pParse->pIdxPartExpr = (IndexedExpr *)0x0;
  iVar9 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
  do {
    sqlite3WhereExplainBloomFilter(pParse,pWInfo,pLevel);
    dest = pParse->nLabel + -1;
    pParse->nLabel = dest;
    iVar4 = pLevel->iTabCur;
    iVar17 = pParse->nMem + 1;
    pParse->nMem = iVar17;
    pLevel->regFilter = iVar17;
    pSrcList = pWInfo->pTabList;
    bVar8 = pLevel->iFrom;
    uVar11 = sqlite3LogEstToInt((pSrcList->a[bVar8].pSTab)->nRowLogEst);
    if (9999999 < uVar11) {
      uVar11 = 10000000;
    }
    if (uVar11 < 0x2711) {
      uVar11 = 10000;
    }
    sqlite3VdbeAddOp3(p,0x4d,(int)uVar11,iVar17,0);
    iVar17 = sqlite3VdbeAddOp3(p,0x24,iVar4,0,0);
    lVar12 = (long)(pWInfo->sWC).nTerm;
    if (0 < lVar12) {
      pWVar18 = (pWInfo->sWC).a;
      pWVar15 = pWVar18 + lVar12;
      do {
        if (((pWVar18->wtFlags & 2) == 0) &&
           (iVar10 = sqlite3ExprIsSingleTableConstraint(pWVar18->pExpr,pSrcList,(uint)bVar8,0),
           iVar10 != 0)) {
          sqlite3ExprIfFalse(pParse,pWVar18->pExpr,dest,0x10);
        }
        pWVar18 = pWVar18 + 1;
      } while (pWVar18 < pWVar15);
    }
    if ((pWVar16->wsFlags & 0x100) == 0) {
      pIdx = (pWVar16->u).btree.pIndex;
      uVar3 = (pWVar16->u).btree.nEq;
      uVar19 = (uint)uVar3;
      iVar10 = sqlite3GetTempRange(pParse,uVar19);
      if (uVar3 != 0) {
        uVar14 = 0;
        do {
          sqlite3ExprCodeLoadIndexColumn(pParse,pIdx,iVar4,uVar14,iVar10 + uVar14);
          uVar14 = uVar14 + 1;
        } while (uVar19 != uVar14);
      }
      sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,iVar10,uVar19);
      if (uVar19 == 1) {
        if (iVar10 != 0) {
          bVar8 = pParse->nTempReg;
          if ((ulong)bVar8 < 8) {
            pParse->nTempReg = bVar8 + 1;
            pParse->aTempReg[bVar8] = iVar10;
          }
        }
      }
      else if (pParse->nRangeReg < (int)uVar19) {
        pParse->nRangeReg = uVar19;
        pParse->iRangeReg = iVar10;
      }
    }
    else {
      if (pParse->nTempReg == '\0') {
        iVar10 = pParse->nMem + 1;
        pParse->nMem = iVar10;
      }
      else {
        bVar8 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar8;
        iVar10 = pParse->aTempReg[bVar8];
      }
      sqlite3VdbeAddOp3(p,0x87,iVar4,iVar10,0);
      sqlite3VdbeAddOp4Int(p,0xb7,pLevel->regFilter,0,iVar10,1);
      if (iVar10 != 0) {
        bVar8 = pParse->nTempReg;
        if ((ulong)bVar8 < 8) {
          pParse->nTempReg = bVar8 + 1;
          pParse->aTempReg[bVar8] = iVar10;
        }
      }
    }
    sqlite3VdbeResolveLabel(p,dest);
    sqlite3VdbeAddOp3(p,0x27,pLevel->iTabCur,iVar17 + 1,0);
    iVar4 = p->nOp;
    uVar2 = p->db->mallocFailed;
    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (uVar2 == '\0') {
      pOVar13 = p->aOp + iVar17;
    }
    pOVar13->p2 = iVar4;
    pbVar1 = (byte *)((long)&pWVar16->wsFlags + 2);
    *pbVar1 = *pbVar1 & 0xbf;
    uVar19 = pParse->db->dbOptFlags;
    if ((uVar19 >> 0x14 & 1) == 0) {
      uVar14 = iLevel + 1;
      iLevel = uVar14;
      if ((int)uVar14 < (int)(uint)pWInfo->nLevel) {
        iLevel = (int)pWInfo->nLevel;
        lVar12 = 0;
        pWVar7 = pWInfo->a + (int)uVar14;
        do {
          pLevel = pWVar7;
          if ((pWInfo->pTabList->a[pLevel->iFrom].fg.jointype & 0x48) == 0) {
            pWVar16 = pLevel->pWLoop;
            if (pWVar16 == (WhereLoop *)0x0) {
              pWVar16 = (WhereLoop *)0x0;
              goto LAB_00195e41;
            }
            if ((pWVar16->prereq & notReady) != 0) goto LAB_00195e41;
            bVar20 = (pWVar16->wsFlags & 0x400004) == 0x400000;
          }
          else {
LAB_00195e41:
            bVar20 = false;
          }
          if (bVar20) {
            iLevel = uVar14 - (int)lVar12;
            break;
          }
          lVar12 = lVar12 + -1;
          pWVar7 = pLevel + 1;
        } while ((long)(int)uVar14 - (ulong)(uint)iLevel != lVar12);
      }
    }
    if (((uVar19 >> 0x14 & 1) != 0) || ((int)(uint)pWInfo->nLevel <= iLevel)) {
      if (uVar2 == '\0') {
        pOVar13 = p->aOp + iVar9;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = iVar4;
      pParse->pIdxEpr = pIVar5;
      pParse->pIdxPartExpr = pIVar6;
      return;
    }
  } while( true );
}

Assistant:

static SQLITE_NOINLINE void sqlite3ConstructBloomFilter(
  WhereInfo *pWInfo,    /* The WHERE clause */
  int iLevel,           /* Index in pWInfo->a[] that is pLevel */
  WhereLevel *pLevel,   /* Make a Bloom filter for this FROM term */
  Bitmask notReady      /* Loops that are not ready */
){
  int addrOnce;                        /* Address of opening OP_Once */
  int addrTop;                         /* Address of OP_Rewind */
  int addrCont;                        /* Jump here to skip a row */
  const WhereTerm *pTerm;              /* For looping over WHERE clause terms */
  const WhereTerm *pWCEnd;             /* Last WHERE clause term */
  Parse *pParse = pWInfo->pParse;      /* Parsing context */
  Vdbe *v = pParse->pVdbe;             /* VDBE under construction */
  WhereLoop *pLoop = pLevel->pWLoop;   /* The loop being coded */
  int iCur;                            /* Cursor for table getting the filter */
  IndexedExpr *saved_pIdxEpr;          /* saved copy of Parse.pIdxEpr */
  IndexedExpr *saved_pIdxPartExpr;     /* saved copy of Parse.pIdxPartExpr */

  saved_pIdxEpr = pParse->pIdxEpr;
  saved_pIdxPartExpr = pParse->pIdxPartExpr;
  pParse->pIdxEpr = 0;
  pParse->pIdxPartExpr = 0;

  assert( pLoop!=0 );
  assert( v!=0 );
  assert( pLoop->wsFlags & WHERE_BLOOMFILTER );
  assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 );

  addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  do{
    const SrcList *pTabList;
    const SrcItem *pItem;
    const Table *pTab;
    u64 sz;
    int iSrc;
    sqlite3WhereExplainBloomFilter(pParse, pWInfo, pLevel);
    addrCont = sqlite3VdbeMakeLabel(pParse);
    iCur = pLevel->iTabCur;
    pLevel->regFilter = ++pParse->nMem;

    /* The Bloom filter is a Blob held in a register.  Initialize it
    ** to zero-filled blob of at least 80K bits, but maybe more if the
    ** estimated size of the table is larger.  We could actually
    ** measure the size of the table at run-time using OP_Count with
    ** P3==1 and use that value to initialize the blob.  But that makes
    ** testing complicated.  By basing the blob size on the value in the
    ** sqlite_stat1 table, testing is much easier.
    */
    pTabList = pWInfo->pTabList;
    iSrc = pLevel->iFrom;
    pItem = &pTabList->a[iSrc];
    assert( pItem!=0 );
    pTab = pItem->pSTab;
    assert( pTab!=0 );
    sz = sqlite3LogEstToInt(pTab->nRowLogEst);
    if( sz<10000 ){
      sz = 10000;
    }else if( sz>10000000 ){
      sz = 10000000;
    }
    sqlite3VdbeAddOp2(v, OP_Blob, (int)sz, pLevel->regFilter);

    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    pWCEnd = &pWInfo->sWC.a[pWInfo->sWC.nTerm];
    for(pTerm=pWInfo->sWC.a; pTerm<pWCEnd; pTerm++){
      Expr *pExpr = pTerm->pExpr;
      if( (pTerm->wtFlags & TERM_VIRTUAL)==0
       && sqlite3ExprIsSingleTableConstraint(pExpr, pTabList, iSrc, 0)
      ){
        sqlite3ExprIfFalse(pParse, pTerm->pExpr, addrCont, SQLITE_JUMPIFNULL);
      }
    }
    if( pLoop->wsFlags & WHERE_IPK ){
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, r1);
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, 1);
      sqlite3ReleaseTempReg(pParse, r1);
    }else{
      Index *pIdx = pLoop->u.btree.pIndex;
      int n = pLoop->u.btree.nEq;
      int r1 = sqlite3GetTempRange(pParse, n);
      int jj;
      for(jj=0; jj<n; jj++){
        assert( pIdx->pTable==pItem->pSTab );
        sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iCur, jj, r1+jj);
      }
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, n);
      sqlite3ReleaseTempRange(pParse, r1, n);
    }
    sqlite3VdbeResolveLabel(v, addrCont);
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrTop);
    pLoop->wsFlags &= ~WHERE_BLOOMFILTER;
    if( OptimizationDisabled(pParse->db, SQLITE_BloomPulldown) ) break;
    while( ++iLevel < pWInfo->nLevel ){
      const SrcItem *pTabItem;
      pLevel = &pWInfo->a[iLevel];
      pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
      if( pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ) ) continue;
      pLoop = pLevel->pWLoop;
      if( NEVER(pLoop==0) ) continue;
      if( pLoop->prereq & notReady ) continue;
      if( (pLoop->wsFlags & (WHERE_BLOOMFILTER|WHERE_COLUMN_IN))
                 ==WHERE_BLOOMFILTER
      ){
        /* This is a candidate for bloom-filter pull-down (early evaluation).
        ** The test that WHERE_COLUMN_IN is omitted is important, as we are
        ** not able to do early evaluation of bloom filters that make use of
        ** the IN operator */
        break;
      }
    }
  }while( iLevel < pWInfo->nLevel );
  sqlite3VdbeJumpHere(v, addrOnce);
  pParse->pIdxEpr = saved_pIdxEpr;
  pParse->pIdxPartExpr = saved_pIdxPartExpr;
}